

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

int mcpl_closeandgzip_outfile(mcpl_outfile_t of)

{
  void *__ptr;
  mcpl_outfile_t of_00;
  int iVar1;
  undefined8 *in_RDI;
  int rc;
  char *filename;
  mcpl_outfileinternal_t *f;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  __ptr = (void *)*in_RDI;
  *in_RDI = 0;
  of_00.internal._4_4_ = in_stack_ffffffffffffffe4;
  of_00.internal._0_4_ = in_stack_ffffffffffffffe0;
  mcpl_close_outfile(of_00);
  iVar1 = mcpl_gzip_file(in_stack_ffffffffffffffd8);
  free(__ptr);
  return iVar1;
}

Assistant:

int mcpl_closeandgzip_outfile(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  char * filename = f->filename;
  f->filename = NULL;//prevent free in mcpl_close_outfile
  mcpl_close_outfile(of);
  int rc = mcpl_gzip_file(filename);
  free(filename);
  return rc;
}